

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_string.hpp
# Opt level: O3

void __thiscall dna_string::build_rank_support(dna_string *this)

{
  uint8_t *puVar1;
  uint64_t *puVar2;
  uint8_t *puVar3;
  pointer ppVar4;
  ulong uVar5;
  pointer ppVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint64_t uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  uint64_t uVar22;
  uint64_t uVar23;
  ushort uVar24;
  long lVar28;
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar38 [16];
  long lVar40;
  long lVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  long lVar44;
  ushort uVar45;
  undefined1 auVar49 [12];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  char cVar64;
  byte bVar84;
  char cVar85;
  byte bVar86;
  char cVar87;
  byte bVar88;
  char cVar89;
  byte bVar90;
  char cVar91;
  byte bVar92;
  undefined1 auVar65 [12];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar67 [12];
  undefined1 auVar80 [16];
  undefined1 auVar68 [12];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  char cVar93;
  byte bVar108;
  char cVar109;
  byte bVar110;
  char cVar111;
  byte bVar112;
  char cVar113;
  byte bVar114;
  char cVar115;
  byte bVar116;
  undefined1 auVar94 [12];
  undefined1 auVar97 [12];
  undefined1 auVar103 [16];
  undefined1 auVar96 [12];
  undefined1 auVar106 [16];
  undefined1 auVar117 [12];
  undefined1 auVar118 [12];
  undefined1 auVar122 [16];
  undefined4 uVar25;
  undefined6 uVar26;
  undefined8 uVar27;
  undefined1 auVar29 [12];
  undefined1 auVar33 [14];
  undefined1 auVar34 [14];
  undefined1 auVar35 [14];
  undefined1 auVar36 [14];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined4 uVar46;
  undefined6 uVar47;
  undefined8 uVar48;
  undefined1 auVar50 [12];
  undefined1 auVar51 [14];
  undefined1 auVar52 [14];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar66 [12];
  undefined1 auVar69 [14];
  undefined1 auVar70 [14];
  undefined1 auVar71 [14];
  undefined1 auVar72 [14];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar95 [12];
  undefined1 auVar98 [14];
  undefined1 auVar99 [14];
  undefined1 auVar100 [14];
  undefined1 auVar101 [14];
  undefined1 auVar102 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar107 [16];
  undefined1 auVar119 [14];
  undefined1 auVar120 [14];
  undefined1 auVar121 [16];
  undefined1 auVar123 [16];
  
  auVar8 = _DAT_0011d070;
  auVar7 = _DAT_0011d060;
  uVar12 = this->n_blocks;
  if (uVar12 == 1) {
    uVar9 = 0;
    uVar20 = 0;
    uVar21 = 0;
    uVar22 = 0;
    uVar23 = 0;
  }
  else {
    puVar3 = this->data;
    ppVar4 = (this->superblock_ranks).super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = 0;
    uVar20 = 0;
    uVar21 = 0;
    uVar22 = 0;
    uVar23 = 0;
    lVar28 = 0;
    lVar40 = 0;
    lVar41 = 0;
    lVar44 = 0;
    do {
      uVar17 = uVar9 >> 0x19;
      if ((uVar9 & 0x1ffffff) == 0) {
        ppVar6 = ppVar4 + uVar17;
        ppVar6->A = uVar20;
        ppVar6->C = uVar21;
        puVar2 = &ppVar4[uVar17].G;
        *puVar2 = uVar22;
        puVar2[1] = uVar23;
        lVar28 = uVar17 * 0x80000000;
        *(undefined1 (*) [16])(puVar3 + lVar28 + 0x30) = (undefined1  [16])0x0;
        uVar17 = *(ulong *)(puVar3 + lVar28 + 0x20);
        uVar13 = *(ulong *)(puVar3 + lVar28 + 0x28);
        uVar14 = *(ulong *)(puVar3 + lVar28);
        uVar15 = *(ulong *)(puVar3 + lVar28 + 8);
        uVar16 = *(ulong *)(puVar3 + lVar28 + 0x10);
        uVar5 = *(ulong *)(puVar3 + lVar28 + 0x18);
        uVar10 = ~(uVar15 | uVar5) & ~uVar13;
        uVar11 = ~(uVar5 | uVar13) & uVar15;
        uVar18 = ~(uVar14 | uVar16) & ~uVar17;
        uVar19 = ~(uVar16 | uVar17) & uVar14;
        auVar42._0_2_ = (ushort)uVar10 >> 1;
        auVar42._2_2_ = (ushort)(uVar10 >> 0x10) >> 1;
        auVar42._4_2_ = (ushort)(uVar10 >> 0x20) >> 1;
        auVar42._6_2_ = (ushort)(uVar10 >> 0x31);
        auVar42._8_2_ = (ushort)uVar11 >> 1;
        auVar42._10_2_ = (ushort)(uVar11 >> 0x10) >> 1;
        auVar42._12_2_ = (ushort)(uVar11 >> 0x20) >> 1;
        auVar42._14_2_ = (ushort)(uVar11 >> 0x31);
        auVar42 = auVar42 & auVar7;
        uVar24 = CONCAT11((char)(uVar10 >> 8) - auVar42[1],(char)uVar10 - auVar42[0]);
        uVar25 = CONCAT13((char)(uVar10 >> 0x18) - auVar42[3],
                          CONCAT12((char)(uVar10 >> 0x10) - auVar42[2],uVar24));
        uVar26 = CONCAT15((char)(uVar10 >> 0x28) - auVar42[5],
                          CONCAT14((char)(uVar10 >> 0x20) - auVar42[4],uVar25));
        uVar27 = CONCAT17((char)(uVar10 >> 0x38) - auVar42[7],
                          CONCAT16((char)(uVar10 >> 0x30) - auVar42[6],uVar26));
        auVar49._0_10_ =
             CONCAT19((char)(uVar11 >> 8) - auVar42[9],CONCAT18((char)uVar11 - auVar42[8],uVar27));
        auVar49[10] = (char)(uVar11 >> 0x10) - auVar42[10];
        auVar49[0xb] = (char)(uVar11 >> 0x18) - auVar42[0xb];
        auVar51[0xc] = (char)(uVar11 >> 0x20) - auVar42[0xc];
        auVar51._0_12_ = auVar49;
        auVar51[0xd] = (char)(uVar11 >> 0x28) - auVar42[0xd];
        auVar58[0xe] = (char)(uVar11 >> 0x30) - auVar42[0xe];
        auVar58._0_14_ = auVar51;
        auVar58[0xf] = (char)(uVar11 >> 0x38) - auVar42[0xf];
        auVar54 = auVar58 & auVar8;
        auVar59._0_2_ = uVar24 >> 2;
        auVar59._2_2_ = (ushort)((uint)uVar25 >> 0x12);
        auVar59._4_2_ = (ushort)((uint6)uVar26 >> 0x22);
        auVar59._6_2_ = (ushort)((ulong)uVar27 >> 0x32);
        auVar59._8_2_ = (ushort)((unkuint10)auVar49._0_10_ >> 0x42);
        auVar59._10_2_ = auVar49._10_2_ >> 2;
        auVar59._12_2_ = auVar51._12_2_ >> 2;
        auVar59._14_2_ = auVar58._14_2_ >> 2;
        auVar59 = auVar59 & auVar8;
        cVar93 = auVar59[0] + auVar54[0];
        bVar108 = auVar59[1] + auVar54[1];
        uVar45 = CONCAT11(bVar108,cVar93);
        cVar109 = auVar59[2] + auVar54[2];
        bVar110 = auVar59[3] + auVar54[3];
        uVar46 = CONCAT13(bVar110,CONCAT12(cVar109,uVar45));
        cVar111 = auVar59[4] + auVar54[4];
        bVar112 = auVar59[5] + auVar54[5];
        uVar47 = CONCAT15(bVar112,CONCAT14(cVar111,uVar46));
        cVar113 = auVar59[6] + auVar54[6];
        bVar114 = auVar59[7] + auVar54[7];
        uVar48 = CONCAT17(bVar114,CONCAT16(cVar113,uVar47));
        cVar115 = auVar59[8] + auVar54[8];
        bVar116 = auVar59[9] + auVar54[9];
        auVar50._0_10_ = CONCAT19(bVar116,CONCAT18(cVar115,uVar48));
        auVar50[10] = auVar59[10] + auVar54[10];
        auVar50[0xb] = auVar59[0xb] + auVar54[0xb];
        auVar52[0xc] = auVar59[0xc] + auVar54[0xc];
        auVar52._0_12_ = auVar50;
        auVar52[0xd] = auVar59[0xd] + auVar54[0xd];
        auVar60[0xe] = auVar59[0xe] + auVar54[0xe];
        auVar60._0_14_ = auVar52;
        auVar60[0xf] = auVar59[0xf] + auVar54[0xf];
        auVar61._0_2_ = (ushort)uVar18 >> 1;
        auVar61._2_2_ = (ushort)(uVar18 >> 0x10) >> 1;
        auVar61._4_2_ = (ushort)(uVar18 >> 0x20) >> 1;
        auVar61._6_2_ = (ushort)(uVar18 >> 0x31);
        auVar61._8_2_ = (ushort)uVar19 >> 1;
        auVar61._10_2_ = (ushort)(uVar19 >> 0x10) >> 1;
        auVar61._12_2_ = (ushort)(uVar19 >> 0x20) >> 1;
        auVar61._14_2_ = (ushort)(uVar19 >> 0x31);
        auVar61 = auVar61 & auVar7;
        uVar24 = CONCAT11((char)(uVar18 >> 8) - auVar61[1],(char)uVar18 - auVar61[0]);
        uVar25 = CONCAT13((char)(uVar18 >> 0x18) - auVar61[3],
                          CONCAT12((char)(uVar18 >> 0x10) - auVar61[2],uVar24));
        uVar26 = CONCAT15((char)(uVar18 >> 0x28) - auVar61[5],
                          CONCAT14((char)(uVar18 >> 0x20) - auVar61[4],uVar25));
        uVar27 = CONCAT17((char)(uVar18 >> 0x38) - auVar61[7],
                          CONCAT16((char)(uVar18 >> 0x30) - auVar61[6],uVar26));
        auVar29._0_10_ =
             CONCAT19((char)(uVar19 >> 8) - auVar61[9],CONCAT18((char)uVar19 - auVar61[8],uVar27));
        auVar29[10] = (char)(uVar19 >> 0x10) - auVar61[10];
        auVar29[0xb] = (char)(uVar19 >> 0x18) - auVar61[0xb];
        auVar33[0xc] = (char)(uVar19 >> 0x20) - auVar61[0xc];
        auVar33._0_12_ = auVar29;
        auVar33[0xd] = (char)(uVar19 >> 0x28) - auVar61[0xd];
        auVar54[0xe] = (char)(uVar19 >> 0x30) - auVar61[0xe];
        auVar54._0_14_ = auVar33;
        auVar54[0xf] = (char)(uVar19 >> 0x38) - auVar61[0xf];
        auVar62 = auVar54 & auVar8;
        auVar57._0_2_ = uVar24 >> 2;
        auVar57._2_2_ = (ushort)((uint)uVar25 >> 0x12);
        auVar57._4_2_ = (ushort)((uint6)uVar26 >> 0x22);
        auVar57._6_2_ = (ushort)((ulong)uVar27 >> 0x32);
        auVar57._8_2_ = (ushort)((unkuint10)auVar29._0_10_ >> 0x42);
        auVar57._10_2_ = auVar29._10_2_ >> 2;
        auVar57._12_2_ = auVar33._12_2_ >> 2;
        auVar57._14_2_ = auVar54._14_2_ >> 2;
        auVar57 = auVar57 & auVar8;
        cVar64 = auVar57[0] + auVar62[0];
        bVar84 = auVar57[1] + auVar62[1];
        uVar24 = CONCAT11(bVar84,cVar64);
        cVar85 = auVar57[2] + auVar62[2];
        bVar86 = auVar57[3] + auVar62[3];
        uVar25 = CONCAT13(bVar86,CONCAT12(cVar85,uVar24));
        cVar87 = auVar57[4] + auVar62[4];
        bVar88 = auVar57[5] + auVar62[5];
        uVar26 = CONCAT15(bVar88,CONCAT14(cVar87,uVar25));
        cVar89 = auVar57[6] + auVar62[6];
        bVar90 = auVar57[7] + auVar62[7];
        uVar27 = CONCAT17(bVar90,CONCAT16(cVar89,uVar26));
        cVar91 = auVar57[8] + auVar62[8];
        bVar92 = auVar57[9] + auVar62[9];
        auVar30._0_10_ = CONCAT19(bVar92,CONCAT18(cVar91,uVar27));
        auVar30[10] = auVar57[10] + auVar62[10];
        auVar30[0xb] = auVar57[0xb] + auVar62[0xb];
        auVar34[0xc] = auVar57[0xc] + auVar62[0xc];
        auVar34._0_12_ = auVar30;
        auVar34[0xd] = auVar57[0xd] + auVar62[0xd];
        auVar37[0xe] = auVar57[0xe] + auVar62[0xe];
        auVar37._0_14_ = auVar34;
        auVar37[0xf] = auVar57[0xf] + auVar62[0xf];
        auVar63[0] = ((char)(uVar24 >> 4) + cVar64 & 0xfU) + ((char)(uVar45 >> 4) + cVar93 & 0xfU);
        auVar63[1] = ((bVar84 >> 4) + bVar84 & 0xf) + ((bVar108 >> 4) + bVar108 & 0xf);
        auVar63[2] = ((char)(ushort)((uint)uVar25 >> 0x14) + cVar85 & 0xfU) +
                     ((char)(ushort)((uint)uVar46 >> 0x14) + cVar109 & 0xfU);
        auVar63[3] = ((bVar86 >> 4) + bVar86 & 0xf) + ((bVar110 >> 4) + bVar110 & 0xf);
        auVar63[4] = ((char)(ushort)((uint6)uVar26 >> 0x24) + cVar87 & 0xfU) +
                     ((char)(ushort)((uint6)uVar47 >> 0x24) + cVar111 & 0xfU);
        auVar63[5] = ((bVar88 >> 4) + bVar88 & 0xf) + ((bVar112 >> 4) + bVar112 & 0xf);
        auVar63[6] = ((char)(ushort)((ulong)uVar27 >> 0x34) + cVar89 & 0xfU) +
                     ((char)(ushort)((ulong)uVar48 >> 0x34) + cVar113 & 0xfU);
        auVar63[7] = ((bVar90 >> 4) + bVar90 & 0xf) + ((bVar114 >> 4) + bVar114 & 0xf);
        auVar63[8] = ((char)(ushort)((unkuint10)auVar30._0_10_ >> 0x44) + cVar91 & 0xfU) +
                     ((char)(ushort)((unkuint10)auVar50._0_10_ >> 0x44) + cVar115 & 0xfU);
        auVar63[9] = ((bVar92 >> 4) + bVar92 & 0xf) + ((bVar116 >> 4) + bVar116 & 0xf);
        auVar63[10] = ((char)(auVar30._10_2_ >> 4) + auVar30[10] & 0xfU) +
                      ((char)(auVar50._10_2_ >> 4) + auVar50[10] & 0xfU);
        auVar63[0xb] = ((auVar30[0xb] >> 4) + auVar30[0xb] & 0xf) +
                       ((auVar50[0xb] >> 4) + auVar50[0xb] & 0xf);
        auVar63[0xc] = ((char)(auVar34._12_2_ >> 4) + auVar34[0xc] & 0xfU) +
                       ((char)(auVar52._12_2_ >> 4) + auVar52[0xc] & 0xfU);
        auVar63[0xd] = ((auVar34[0xd] >> 4) + auVar34[0xd] & 0xf) +
                       ((auVar52[0xd] >> 4) + auVar52[0xd] & 0xf);
        auVar63[0xe] = ((char)(auVar37._14_2_ >> 4) + auVar37[0xe] & 0xfU) +
                       ((char)(auVar60._14_2_ >> 4) + auVar60[0xe] & 0xfU);
        auVar63[0xf] = ((auVar37[0xf] >> 4) + auVar37[0xf] & 0xf) +
                       ((auVar60[0xf] >> 4) + auVar60[0xf] & 0xf);
        auVar57 = psadbw(auVar63,(undefined1  [16])0x0);
        uVar10 = ~(uVar13 | uVar15) & uVar5;
        uVar15 = uVar15 & uVar5 & ~uVar13;
        uVar13 = ~(uVar17 | uVar14) & uVar16;
        uVar17 = uVar14 & uVar16 & ~uVar17;
        auVar43._0_2_ = (ushort)uVar10 >> 1;
        auVar43._2_2_ = (ushort)(uVar10 >> 0x10) >> 1;
        auVar43._4_2_ = (ushort)(uVar10 >> 0x20) >> 1;
        auVar43._6_2_ = (ushort)(uVar10 >> 0x31);
        auVar43._8_2_ = (ushort)uVar15 >> 1;
        auVar43._10_2_ = (ushort)(uVar15 >> 0x10) >> 1;
        auVar43._12_2_ = (ushort)(uVar15 >> 0x20) >> 1;
        auVar43._14_2_ = (ushort)(uVar15 >> 0x31);
        auVar43 = auVar43 & auVar7;
        uVar24 = CONCAT11((char)(uVar10 >> 8) - auVar43[1],(char)uVar10 - auVar43[0]);
        uVar25 = CONCAT13((char)(uVar10 >> 0x18) - auVar43[3],
                          CONCAT12((char)(uVar10 >> 0x10) - auVar43[2],uVar24));
        uVar26 = CONCAT15((char)(uVar10 >> 0x28) - auVar43[5],
                          CONCAT14((char)(uVar10 >> 0x20) - auVar43[4],uVar25));
        uVar27 = CONCAT17((char)(uVar10 >> 0x38) - auVar43[7],
                          CONCAT16((char)(uVar10 >> 0x30) - auVar43[6],uVar26));
        auVar67._0_10_ =
             CONCAT19((char)(uVar15 >> 8) - auVar43[9],CONCAT18((char)uVar15 - auVar43[8],uVar27));
        auVar67[10] = (char)(uVar15 >> 0x10) - auVar43[10];
        auVar67[0xb] = (char)(uVar15 >> 0x18) - auVar43[0xb];
        auVar71[0xc] = (char)(uVar15 >> 0x20) - auVar43[0xc];
        auVar71._0_12_ = auVar67;
        auVar71[0xd] = (char)(uVar15 >> 0x28) - auVar43[0xd];
        auVar79[0xe] = (char)(uVar15 >> 0x30) - auVar43[0xe];
        auVar79._0_14_ = auVar71;
        auVar79[0xf] = (char)(uVar15 >> 0x38) - auVar43[0xf];
        auVar54 = auVar79 & auVar8;
        auVar80._0_2_ = uVar24 >> 2;
        auVar80._2_2_ = (ushort)((uint)uVar25 >> 0x12);
        auVar80._4_2_ = (ushort)((uint6)uVar26 >> 0x22);
        auVar80._6_2_ = (ushort)((ulong)uVar27 >> 0x32);
        auVar80._8_2_ = (ushort)((unkuint10)auVar67._0_10_ >> 0x42);
        auVar80._10_2_ = auVar67._10_2_ >> 2;
        auVar80._12_2_ = auVar71._12_2_ >> 2;
        auVar80._14_2_ = auVar79._14_2_ >> 2;
        auVar80 = auVar80 & auVar8;
        cVar93 = auVar80[0] + auVar54[0];
        bVar108 = auVar80[1] + auVar54[1];
        uVar45 = CONCAT11(bVar108,cVar93);
        cVar109 = auVar80[2] + auVar54[2];
        bVar110 = auVar80[3] + auVar54[3];
        uVar46 = CONCAT13(bVar110,CONCAT12(cVar109,uVar45));
        cVar111 = auVar80[4] + auVar54[4];
        bVar112 = auVar80[5] + auVar54[5];
        uVar47 = CONCAT15(bVar112,CONCAT14(cVar111,uVar46));
        cVar113 = auVar80[6] + auVar54[6];
        bVar114 = auVar80[7] + auVar54[7];
        uVar48 = CONCAT17(bVar114,CONCAT16(cVar113,uVar47));
        cVar115 = auVar80[8] + auVar54[8];
        bVar116 = auVar80[9] + auVar54[9];
        auVar68._0_10_ = CONCAT19(bVar116,CONCAT18(cVar115,uVar48));
        auVar68[10] = auVar80[10] + auVar54[10];
        auVar68[0xb] = auVar80[0xb] + auVar54[0xb];
        auVar72[0xc] = auVar80[0xc] + auVar54[0xc];
        auVar72._0_12_ = auVar68;
        auVar72[0xd] = auVar80[0xd] + auVar54[0xd];
        auVar81[0xe] = auVar80[0xe] + auVar54[0xe];
        auVar81._0_14_ = auVar72;
        auVar81[0xf] = auVar80[0xf] + auVar54[0xf];
        auVar82._0_2_ = (ushort)uVar13 >> 1;
        auVar82._2_2_ = (ushort)(uVar13 >> 0x10) >> 1;
        auVar82._4_2_ = (ushort)(uVar13 >> 0x20) >> 1;
        auVar82._6_2_ = (ushort)(uVar13 >> 0x31);
        auVar82._8_2_ = (ushort)uVar17 >> 1;
        auVar82._10_2_ = (ushort)(uVar17 >> 0x10) >> 1;
        auVar82._12_2_ = (ushort)(uVar17 >> 0x20) >> 1;
        auVar82._14_2_ = (ushort)(uVar17 >> 0x31);
        auVar82 = auVar82 & auVar7;
        uVar24 = CONCAT11((char)(uVar13 >> 8) - auVar82[1],(char)uVar13 - auVar82[0]);
        uVar25 = CONCAT13((char)(uVar13 >> 0x18) - auVar82[3],
                          CONCAT12((char)(uVar13 >> 0x10) - auVar82[2],uVar24));
        uVar26 = CONCAT15((char)(uVar13 >> 0x28) - auVar82[5],
                          CONCAT14((char)(uVar13 >> 0x20) - auVar82[4],uVar25));
        uVar27 = CONCAT17((char)(uVar13 >> 0x38) - auVar82[7],
                          CONCAT16((char)(uVar13 >> 0x30) - auVar82[6],uVar26));
        auVar31._0_10_ =
             CONCAT19((char)(uVar17 >> 8) - auVar82[9],CONCAT18((char)uVar17 - auVar82[8],uVar27));
        auVar31[10] = (char)(uVar17 >> 0x10) - auVar82[10];
        auVar31[0xb] = (char)(uVar17 >> 0x18) - auVar82[0xb];
        auVar35[0xc] = (char)(uVar17 >> 0x20) - auVar82[0xc];
        auVar35._0_12_ = auVar31;
        auVar35[0xd] = (char)(uVar17 >> 0x28) - auVar82[0xd];
        auVar62[0xe] = (char)(uVar17 >> 0x30) - auVar82[0xe];
        auVar62._0_14_ = auVar35;
        auVar62[0xf] = (char)(uVar17 >> 0x38) - auVar82[0xf];
        auVar54 = auVar62 & auVar8;
        auVar38._0_2_ = uVar24 >> 2;
        auVar38._2_2_ = (ushort)((uint)uVar25 >> 0x12);
        auVar38._4_2_ = (ushort)((uint6)uVar26 >> 0x22);
        auVar38._6_2_ = (ushort)((ulong)uVar27 >> 0x32);
        auVar38._8_2_ = (ushort)((unkuint10)auVar31._0_10_ >> 0x42);
        auVar38._10_2_ = auVar31._10_2_ >> 2;
        auVar38._12_2_ = auVar35._12_2_ >> 2;
        auVar38._14_2_ = auVar62._14_2_ >> 2;
        auVar38 = auVar38 & auVar8;
        cVar64 = auVar38[0] + auVar54[0];
        bVar84 = auVar38[1] + auVar54[1];
        uVar24 = CONCAT11(bVar84,cVar64);
        cVar85 = auVar38[2] + auVar54[2];
        bVar86 = auVar38[3] + auVar54[3];
        uVar25 = CONCAT13(bVar86,CONCAT12(cVar85,uVar24));
        cVar87 = auVar38[4] + auVar54[4];
        bVar88 = auVar38[5] + auVar54[5];
        uVar26 = CONCAT15(bVar88,CONCAT14(cVar87,uVar25));
        cVar89 = auVar38[6] + auVar54[6];
        bVar90 = auVar38[7] + auVar54[7];
        uVar27 = CONCAT17(bVar90,CONCAT16(cVar89,uVar26));
        cVar91 = auVar38[8] + auVar54[8];
        bVar92 = auVar38[9] + auVar54[9];
        auVar32._0_10_ = CONCAT19(bVar92,CONCAT18(cVar91,uVar27));
        auVar32[10] = auVar38[10] + auVar54[10];
        auVar32[0xb] = auVar38[0xb] + auVar54[0xb];
        auVar36[0xc] = auVar38[0xc] + auVar54[0xc];
        auVar36._0_12_ = auVar32;
        auVar36[0xd] = auVar38[0xd] + auVar54[0xd];
        auVar39[0xe] = auVar38[0xe] + auVar54[0xe];
        auVar39._0_14_ = auVar36;
        auVar39[0xf] = auVar38[0xf] + auVar54[0xf];
        auVar83[0] = ((char)(uVar24 >> 4) + cVar64 & 0xfU) + ((char)(uVar45 >> 4) + cVar93 & 0xfU);
        auVar83[1] = ((bVar84 >> 4) + bVar84 & 0xf) + ((bVar108 >> 4) + bVar108 & 0xf);
        auVar83[2] = ((char)(ushort)((uint)uVar25 >> 0x14) + cVar85 & 0xfU) +
                     ((char)(ushort)((uint)uVar46 >> 0x14) + cVar109 & 0xfU);
        auVar83[3] = ((bVar86 >> 4) + bVar86 & 0xf) + ((bVar110 >> 4) + bVar110 & 0xf);
        auVar83[4] = ((char)(ushort)((uint6)uVar26 >> 0x24) + cVar87 & 0xfU) +
                     ((char)(ushort)((uint6)uVar47 >> 0x24) + cVar111 & 0xfU);
        auVar83[5] = ((bVar88 >> 4) + bVar88 & 0xf) + ((bVar112 >> 4) + bVar112 & 0xf);
        auVar83[6] = ((char)(ushort)((ulong)uVar27 >> 0x34) + cVar89 & 0xfU) +
                     ((char)(ushort)((ulong)uVar48 >> 0x34) + cVar113 & 0xfU);
        auVar83[7] = ((bVar90 >> 4) + bVar90 & 0xf) + ((bVar114 >> 4) + bVar114 & 0xf);
        auVar83[8] = ((char)(ushort)((unkuint10)auVar32._0_10_ >> 0x44) + cVar91 & 0xfU) +
                     ((char)(ushort)((unkuint10)auVar68._0_10_ >> 0x44) + cVar115 & 0xfU);
        auVar83[9] = ((bVar92 >> 4) + bVar92 & 0xf) + ((bVar116 >> 4) + bVar116 & 0xf);
        auVar83[10] = ((char)(auVar32._10_2_ >> 4) + auVar32[10] & 0xfU) +
                      ((char)(auVar68._10_2_ >> 4) + auVar68[10] & 0xfU);
        auVar83[0xb] = ((auVar32[0xb] >> 4) + auVar32[0xb] & 0xf) +
                       ((auVar68[0xb] >> 4) + auVar68[0xb] & 0xf);
        auVar83[0xc] = ((char)(auVar36._12_2_ >> 4) + auVar36[0xc] & 0xfU) +
                       ((char)(auVar72._12_2_ >> 4) + auVar72[0xc] & 0xfU);
        auVar83[0xd] = ((auVar36[0xd] >> 4) + auVar36[0xd] & 0xf) +
                       ((auVar72[0xd] >> 4) + auVar72[0xd] & 0xf);
        auVar83[0xe] = ((char)(auVar39._14_2_ >> 4) + auVar39[0xe] & 0xfU) +
                       ((char)(auVar81._14_2_ >> 4) + auVar81[0xe] & 0xfU);
        auVar83[0xf] = ((auVar39[0xf] >> 4) + auVar39[0xf] & 0xf) +
                       ((auVar81[0xf] >> 4) + auVar81[0xf] & 0xf);
        auVar54 = psadbw(auVar83,(undefined1  [16])0x0);
        uVar12 = this->n_blocks;
        lVar28 = 0;
        lVar40 = 0;
        lVar41 = 0;
        lVar44 = 0;
      }
      else {
        uVar10 = (ulong)(uint)((int)(uVar9 & 0x1ffffff) << 6);
        puVar1 = puVar3 + uVar10 + 0x30 + uVar17 * 0x80000000;
        *(int *)puVar1 = (int)lVar28;
        *(int *)(puVar1 + 4) = (int)lVar40;
        *(int *)(puVar1 + 8) = (int)lVar41;
        *(int *)(puVar1 + 0xc) = (int)lVar44;
        uVar13 = *(ulong *)(puVar3 + uVar10 + 0x20 + uVar17 * 0x80000000);
        uVar14 = *(ulong *)(puVar3 + uVar10 + 0x28 + uVar17 * 0x80000000);
        uVar15 = *(ulong *)(puVar3 + uVar10 + uVar17 * 0x80000000);
        uVar16 = *(ulong *)(puVar3 + uVar10 + 8 + uVar17 * 0x80000000);
        uVar5 = *(ulong *)(puVar3 + uVar10 + 0x10 + uVar17 * 0x80000000);
        uVar17 = *(ulong *)(puVar3 + uVar10 + 0x18 + uVar17 * 0x80000000);
        uVar18 = ~(uVar16 | uVar17) & ~uVar14;
        uVar11 = ~(uVar17 | uVar14) & uVar16;
        uVar10 = ~(uVar15 | uVar5) & ~uVar13;
        uVar19 = ~(uVar5 | uVar13) & uVar15;
        auVar53._0_2_ = (ushort)uVar18 >> 1;
        auVar53._2_2_ = (ushort)(uVar18 >> 0x10) >> 1;
        auVar53._4_2_ = (ushort)(uVar18 >> 0x20) >> 1;
        auVar53._6_2_ = (ushort)(uVar18 >> 0x31);
        auVar53._8_2_ = (ushort)uVar11 >> 1;
        auVar53._10_2_ = (ushort)(uVar11 >> 0x10) >> 1;
        auVar53._12_2_ = (ushort)(uVar11 >> 0x20) >> 1;
        auVar53._14_2_ = (ushort)(uVar11 >> 0x31);
        auVar53 = auVar53 & auVar7;
        uVar24 = CONCAT11((char)(uVar18 >> 8) - auVar53[1],(char)uVar18 - auVar53[0]);
        uVar25 = CONCAT13((char)(uVar18 >> 0x18) - auVar53[3],
                          CONCAT12((char)(uVar18 >> 0x10) - auVar53[2],uVar24));
        uVar26 = CONCAT15((char)(uVar18 >> 0x28) - auVar53[5],
                          CONCAT14((char)(uVar18 >> 0x20) - auVar53[4],uVar25));
        uVar27 = CONCAT17((char)(uVar18 >> 0x38) - auVar53[7],
                          CONCAT16((char)(uVar18 >> 0x30) - auVar53[6],uVar26));
        auVar94._0_10_ =
             CONCAT19((char)(uVar11 >> 8) - auVar53[9],CONCAT18((char)uVar11 - auVar53[8],uVar27));
        auVar94[10] = (char)(uVar11 >> 0x10) - auVar53[10];
        auVar94[0xb] = (char)(uVar11 >> 0x18) - auVar53[0xb];
        auVar98[0xc] = (char)(uVar11 >> 0x20) - auVar53[0xc];
        auVar98._0_12_ = auVar94;
        auVar98[0xd] = (char)(uVar11 >> 0x28) - auVar53[0xd];
        auVar102[0xe] = (char)(uVar11 >> 0x30) - auVar53[0xe];
        auVar102._0_14_ = auVar98;
        auVar102[0xf] = (char)(uVar11 >> 0x38) - auVar53[0xf];
        auVar54 = auVar102 & auVar8;
        auVar103._0_2_ = uVar24 >> 2;
        auVar103._2_2_ = (ushort)((uint)uVar25 >> 0x12);
        auVar103._4_2_ = (ushort)((uint6)uVar26 >> 0x22);
        auVar103._6_2_ = (ushort)((ulong)uVar27 >> 0x32);
        auVar103._8_2_ = (ushort)((unkuint10)auVar94._0_10_ >> 0x42);
        auVar103._10_2_ = auVar94._10_2_ >> 2;
        auVar103._12_2_ = auVar98._12_2_ >> 2;
        auVar103._14_2_ = auVar102._14_2_ >> 2;
        auVar103 = auVar103 & auVar8;
        cVar93 = auVar103[0] + auVar54[0];
        bVar108 = auVar103[1] + auVar54[1];
        uVar45 = CONCAT11(bVar108,cVar93);
        cVar109 = auVar103[2] + auVar54[2];
        bVar110 = auVar103[3] + auVar54[3];
        uVar46 = CONCAT13(bVar110,CONCAT12(cVar109,uVar45));
        cVar111 = auVar103[4] + auVar54[4];
        bVar112 = auVar103[5] + auVar54[5];
        uVar47 = CONCAT15(bVar112,CONCAT14(cVar111,uVar46));
        cVar113 = auVar103[6] + auVar54[6];
        bVar114 = auVar103[7] + auVar54[7];
        uVar48 = CONCAT17(bVar114,CONCAT16(cVar113,uVar47));
        cVar115 = auVar103[8] + auVar54[8];
        bVar116 = auVar103[9] + auVar54[9];
        auVar95._0_10_ = CONCAT19(bVar116,CONCAT18(cVar115,uVar48));
        auVar95[10] = auVar103[10] + auVar54[10];
        auVar95[0xb] = auVar103[0xb] + auVar54[0xb];
        auVar99[0xc] = auVar103[0xc] + auVar54[0xc];
        auVar99._0_12_ = auVar95;
        auVar99[0xd] = auVar103[0xd] + auVar54[0xd];
        auVar104[0xe] = auVar103[0xe] + auVar54[0xe];
        auVar104._0_14_ = auVar99;
        auVar104[0xf] = auVar103[0xf] + auVar54[0xf];
        auVar55._0_2_ = (ushort)uVar10 >> 1;
        auVar55._2_2_ = (ushort)(uVar10 >> 0x10) >> 1;
        auVar55._4_2_ = (ushort)(uVar10 >> 0x20) >> 1;
        auVar55._6_2_ = (ushort)(uVar10 >> 0x31);
        auVar55._8_2_ = (ushort)uVar19 >> 1;
        auVar55._10_2_ = (ushort)(uVar19 >> 0x10) >> 1;
        auVar55._12_2_ = (ushort)(uVar19 >> 0x20) >> 1;
        auVar55._14_2_ = (ushort)(uVar19 >> 0x31);
        auVar55 = auVar55 & auVar7;
        uVar24 = CONCAT11((char)(uVar10 >> 8) - auVar55[1],(char)uVar10 - auVar55[0]);
        uVar25 = CONCAT13((char)(uVar10 >> 0x18) - auVar55[3],
                          CONCAT12((char)(uVar10 >> 0x10) - auVar55[2],uVar24));
        uVar26 = CONCAT15((char)(uVar10 >> 0x28) - auVar55[5],
                          CONCAT14((char)(uVar10 >> 0x20) - auVar55[4],uVar25));
        uVar27 = CONCAT17((char)(uVar10 >> 0x38) - auVar55[7],
                          CONCAT16((char)(uVar10 >> 0x30) - auVar55[6],uVar26));
        auVar65._0_10_ =
             CONCAT19((char)(uVar19 >> 8) - auVar55[9],CONCAT18((char)uVar19 - auVar55[8],uVar27));
        auVar65[10] = (char)(uVar19 >> 0x10) - auVar55[10];
        auVar65[0xb] = (char)(uVar19 >> 0x18) - auVar55[0xb];
        auVar69[0xc] = (char)(uVar19 >> 0x20) - auVar55[0xc];
        auVar69._0_12_ = auVar65;
        auVar69[0xd] = (char)(uVar19 >> 0x28) - auVar55[0xd];
        auVar73[0xe] = (char)(uVar19 >> 0x30) - auVar55[0xe];
        auVar73._0_14_ = auVar69;
        auVar73[0xf] = (char)(uVar19 >> 0x38) - auVar55[0xf];
        auVar54 = auVar73 & auVar8;
        auVar74._0_2_ = uVar24 >> 2;
        auVar74._2_2_ = (ushort)((uint)uVar25 >> 0x12);
        auVar74._4_2_ = (ushort)((uint6)uVar26 >> 0x22);
        auVar74._6_2_ = (ushort)((ulong)uVar27 >> 0x32);
        auVar74._8_2_ = (ushort)((unkuint10)auVar65._0_10_ >> 0x42);
        auVar74._10_2_ = auVar65._10_2_ >> 2;
        auVar74._12_2_ = auVar69._12_2_ >> 2;
        auVar74._14_2_ = auVar73._14_2_ >> 2;
        auVar74 = auVar74 & auVar8;
        cVar64 = auVar74[0] + auVar54[0];
        bVar84 = auVar74[1] + auVar54[1];
        uVar24 = CONCAT11(bVar84,cVar64);
        cVar85 = auVar74[2] + auVar54[2];
        bVar86 = auVar74[3] + auVar54[3];
        uVar25 = CONCAT13(bVar86,CONCAT12(cVar85,uVar24));
        cVar87 = auVar74[4] + auVar54[4];
        bVar88 = auVar74[5] + auVar54[5];
        uVar26 = CONCAT15(bVar88,CONCAT14(cVar87,uVar25));
        cVar89 = auVar74[6] + auVar54[6];
        bVar90 = auVar74[7] + auVar54[7];
        uVar27 = CONCAT17(bVar90,CONCAT16(cVar89,uVar26));
        cVar91 = auVar74[8] + auVar54[8];
        bVar92 = auVar74[9] + auVar54[9];
        auVar66._0_10_ = CONCAT19(bVar92,CONCAT18(cVar91,uVar27));
        auVar66[10] = auVar74[10] + auVar54[10];
        auVar66[0xb] = auVar74[0xb] + auVar54[0xb];
        auVar70[0xc] = auVar74[0xc] + auVar54[0xc];
        auVar70._0_12_ = auVar66;
        auVar70[0xd] = auVar74[0xd] + auVar54[0xd];
        auVar75[0xe] = auVar74[0xe] + auVar54[0xe];
        auVar75._0_14_ = auVar70;
        auVar75[0xf] = auVar74[0xf] + auVar54[0xf];
        auVar56[0] = ((char)(uVar24 >> 4) + cVar64 & 0xfU) + ((char)(uVar45 >> 4) + cVar93 & 0xfU);
        auVar56[1] = ((bVar84 >> 4) + bVar84 & 0xf) + ((bVar108 >> 4) + bVar108 & 0xf);
        auVar56[2] = ((char)(ushort)((uint)uVar25 >> 0x14) + cVar85 & 0xfU) +
                     ((char)(ushort)((uint)uVar46 >> 0x14) + cVar109 & 0xfU);
        auVar56[3] = ((bVar86 >> 4) + bVar86 & 0xf) + ((bVar110 >> 4) + bVar110 & 0xf);
        auVar56[4] = ((char)(ushort)((uint6)uVar26 >> 0x24) + cVar87 & 0xfU) +
                     ((char)(ushort)((uint6)uVar47 >> 0x24) + cVar111 & 0xfU);
        auVar56[5] = ((bVar88 >> 4) + bVar88 & 0xf) + ((bVar112 >> 4) + bVar112 & 0xf);
        auVar56[6] = ((char)(ushort)((ulong)uVar27 >> 0x34) + cVar89 & 0xfU) +
                     ((char)(ushort)((ulong)uVar48 >> 0x34) + cVar113 & 0xfU);
        auVar56[7] = ((bVar90 >> 4) + bVar90 & 0xf) + ((bVar114 >> 4) + bVar114 & 0xf);
        auVar56[8] = ((char)(ushort)((unkuint10)auVar66._0_10_ >> 0x44) + cVar91 & 0xfU) +
                     ((char)(ushort)((unkuint10)auVar95._0_10_ >> 0x44) + cVar115 & 0xfU);
        auVar56[9] = ((bVar92 >> 4) + bVar92 & 0xf) + ((bVar116 >> 4) + bVar116 & 0xf);
        auVar56[10] = ((char)(auVar66._10_2_ >> 4) + auVar66[10] & 0xfU) +
                      ((char)(auVar95._10_2_ >> 4) + auVar95[10] & 0xfU);
        auVar56[0xb] = ((auVar66[0xb] >> 4) + auVar66[0xb] & 0xf) +
                       ((auVar95[0xb] >> 4) + auVar95[0xb] & 0xf);
        auVar56[0xc] = ((char)(auVar70._12_2_ >> 4) + auVar70[0xc] & 0xfU) +
                       ((char)(auVar99._12_2_ >> 4) + auVar99[0xc] & 0xfU);
        auVar56[0xd] = ((auVar70[0xd] >> 4) + auVar70[0xd] & 0xf) +
                       ((auVar99[0xd] >> 4) + auVar99[0xd] & 0xf);
        auVar56[0xe] = ((char)(auVar75._14_2_ >> 4) + auVar75[0xe] & 0xfU) +
                       ((char)(auVar104._14_2_ >> 4) + auVar104[0xe] & 0xfU);
        auVar56[0xf] = ((auVar75[0xf] >> 4) + auVar75[0xf] & 0xf) +
                       ((auVar104[0xf] >> 4) + auVar104[0xf] & 0xf);
        auVar57 = psadbw(auVar56,(undefined1  [16])0x0);
        uVar10 = ~(uVar14 | uVar16) & uVar17;
        uVar16 = uVar16 & uVar17 & ~uVar14;
        uVar14 = ~(uVar13 | uVar15) & uVar5;
        uVar17 = uVar15 & uVar5 & ~uVar13;
        auVar76._0_2_ = (ushort)uVar10 >> 1;
        auVar76._2_2_ = (ushort)(uVar10 >> 0x10) >> 1;
        auVar76._4_2_ = (ushort)(uVar10 >> 0x20) >> 1;
        auVar76._6_2_ = (ushort)(uVar10 >> 0x31);
        auVar76._8_2_ = (ushort)uVar16 >> 1;
        auVar76._10_2_ = (ushort)(uVar16 >> 0x10) >> 1;
        auVar76._12_2_ = (ushort)(uVar16 >> 0x20) >> 1;
        auVar76._14_2_ = (ushort)(uVar16 >> 0x31);
        auVar76 = auVar76 & auVar7;
        uVar24 = CONCAT11((char)(uVar10 >> 8) - auVar76[1],(char)uVar10 - auVar76[0]);
        uVar25 = CONCAT13((char)(uVar10 >> 0x18) - auVar76[3],
                          CONCAT12((char)(uVar10 >> 0x10) - auVar76[2],uVar24));
        uVar26 = CONCAT15((char)(uVar10 >> 0x28) - auVar76[5],
                          CONCAT14((char)(uVar10 >> 0x20) - auVar76[4],uVar25));
        uVar27 = CONCAT17((char)(uVar10 >> 0x38) - auVar76[7],
                          CONCAT16((char)(uVar10 >> 0x30) - auVar76[6],uVar26));
        auVar117._0_10_ =
             CONCAT19((char)(uVar16 >> 8) - auVar76[9],CONCAT18((char)uVar16 - auVar76[8],uVar27));
        auVar117[10] = (char)(uVar16 >> 0x10) - auVar76[10];
        auVar117[0xb] = (char)(uVar16 >> 0x18) - auVar76[0xb];
        auVar119[0xc] = (char)(uVar16 >> 0x20) - auVar76[0xc];
        auVar119._0_12_ = auVar117;
        auVar119[0xd] = (char)(uVar16 >> 0x28) - auVar76[0xd];
        auVar121[0xe] = (char)(uVar16 >> 0x30) - auVar76[0xe];
        auVar121._0_14_ = auVar119;
        auVar121[0xf] = (char)(uVar16 >> 0x38) - auVar76[0xf];
        auVar54 = auVar121 & auVar8;
        auVar122._0_2_ = uVar24 >> 2;
        auVar122._2_2_ = (ushort)((uint)uVar25 >> 0x12);
        auVar122._4_2_ = (ushort)((uint6)uVar26 >> 0x22);
        auVar122._6_2_ = (ushort)((ulong)uVar27 >> 0x32);
        auVar122._8_2_ = (ushort)((unkuint10)auVar117._0_10_ >> 0x42);
        auVar122._10_2_ = auVar117._10_2_ >> 2;
        auVar122._12_2_ = auVar119._12_2_ >> 2;
        auVar122._14_2_ = auVar121._14_2_ >> 2;
        auVar122 = auVar122 & auVar8;
        cVar93 = auVar122[0] + auVar54[0];
        bVar108 = auVar122[1] + auVar54[1];
        uVar45 = CONCAT11(bVar108,cVar93);
        cVar109 = auVar122[2] + auVar54[2];
        bVar110 = auVar122[3] + auVar54[3];
        uVar46 = CONCAT13(bVar110,CONCAT12(cVar109,uVar45));
        cVar111 = auVar122[4] + auVar54[4];
        bVar112 = auVar122[5] + auVar54[5];
        uVar47 = CONCAT15(bVar112,CONCAT14(cVar111,uVar46));
        cVar113 = auVar122[6] + auVar54[6];
        bVar114 = auVar122[7] + auVar54[7];
        uVar48 = CONCAT17(bVar114,CONCAT16(cVar113,uVar47));
        cVar115 = auVar122[8] + auVar54[8];
        bVar116 = auVar122[9] + auVar54[9];
        auVar118._0_10_ = CONCAT19(bVar116,CONCAT18(cVar115,uVar48));
        auVar118[10] = auVar122[10] + auVar54[10];
        auVar118[0xb] = auVar122[0xb] + auVar54[0xb];
        auVar120[0xc] = auVar122[0xc] + auVar54[0xc];
        auVar120._0_12_ = auVar118;
        auVar120[0xd] = auVar122[0xd] + auVar54[0xd];
        auVar123[0xe] = auVar122[0xe] + auVar54[0xe];
        auVar123._0_14_ = auVar120;
        auVar123[0xf] = auVar122[0xf] + auVar54[0xf];
        auVar77._0_2_ = (ushort)uVar14 >> 1;
        auVar77._2_2_ = (ushort)(uVar14 >> 0x10) >> 1;
        auVar77._4_2_ = (ushort)(uVar14 >> 0x20) >> 1;
        auVar77._6_2_ = (ushort)(uVar14 >> 0x31);
        auVar77._8_2_ = (ushort)uVar17 >> 1;
        auVar77._10_2_ = (ushort)(uVar17 >> 0x10) >> 1;
        auVar77._12_2_ = (ushort)(uVar17 >> 0x20) >> 1;
        auVar77._14_2_ = (ushort)(uVar17 >> 0x31);
        auVar77 = auVar77 & auVar7;
        uVar24 = CONCAT11((char)(uVar14 >> 8) - auVar77[1],(char)uVar14 - auVar77[0]);
        uVar25 = CONCAT13((char)(uVar14 >> 0x18) - auVar77[3],
                          CONCAT12((char)(uVar14 >> 0x10) - auVar77[2],uVar24));
        uVar26 = CONCAT15((char)(uVar14 >> 0x28) - auVar77[5],
                          CONCAT14((char)(uVar14 >> 0x20) - auVar77[4],uVar25));
        uVar27 = CONCAT17((char)(uVar14 >> 0x38) - auVar77[7],
                          CONCAT16((char)(uVar14 >> 0x30) - auVar77[6],uVar26));
        auVar96._0_10_ =
             CONCAT19((char)(uVar17 >> 8) - auVar77[9],CONCAT18((char)uVar17 - auVar77[8],uVar27));
        auVar96[10] = (char)(uVar17 >> 0x10) - auVar77[10];
        auVar96[0xb] = (char)(uVar17 >> 0x18) - auVar77[0xb];
        auVar100[0xc] = (char)(uVar17 >> 0x20) - auVar77[0xc];
        auVar100._0_12_ = auVar96;
        auVar100[0xd] = (char)(uVar17 >> 0x28) - auVar77[0xd];
        auVar105[0xe] = (char)(uVar17 >> 0x30) - auVar77[0xe];
        auVar105._0_14_ = auVar100;
        auVar105[0xf] = (char)(uVar17 >> 0x38) - auVar77[0xf];
        auVar54 = auVar105 & auVar8;
        auVar106._0_2_ = uVar24 >> 2;
        auVar106._2_2_ = (ushort)((uint)uVar25 >> 0x12);
        auVar106._4_2_ = (ushort)((uint6)uVar26 >> 0x22);
        auVar106._6_2_ = (ushort)((ulong)uVar27 >> 0x32);
        auVar106._8_2_ = (ushort)((unkuint10)auVar96._0_10_ >> 0x42);
        auVar106._10_2_ = auVar96._10_2_ >> 2;
        auVar106._12_2_ = auVar100._12_2_ >> 2;
        auVar106._14_2_ = auVar105._14_2_ >> 2;
        auVar106 = auVar106 & auVar8;
        cVar64 = auVar106[0] + auVar54[0];
        bVar84 = auVar106[1] + auVar54[1];
        uVar24 = CONCAT11(bVar84,cVar64);
        cVar85 = auVar106[2] + auVar54[2];
        bVar86 = auVar106[3] + auVar54[3];
        uVar25 = CONCAT13(bVar86,CONCAT12(cVar85,uVar24));
        cVar87 = auVar106[4] + auVar54[4];
        bVar88 = auVar106[5] + auVar54[5];
        uVar26 = CONCAT15(bVar88,CONCAT14(cVar87,uVar25));
        cVar89 = auVar106[6] + auVar54[6];
        bVar90 = auVar106[7] + auVar54[7];
        uVar27 = CONCAT17(bVar90,CONCAT16(cVar89,uVar26));
        cVar91 = auVar106[8] + auVar54[8];
        bVar92 = auVar106[9] + auVar54[9];
        auVar97._0_10_ = CONCAT19(bVar92,CONCAT18(cVar91,uVar27));
        auVar97[10] = auVar106[10] + auVar54[10];
        auVar97[0xb] = auVar106[0xb] + auVar54[0xb];
        auVar101[0xc] = auVar106[0xc] + auVar54[0xc];
        auVar101._0_12_ = auVar97;
        auVar101[0xd] = auVar106[0xd] + auVar54[0xd];
        auVar107[0xe] = auVar106[0xe] + auVar54[0xe];
        auVar107._0_14_ = auVar101;
        auVar107[0xf] = auVar106[0xf] + auVar54[0xf];
        auVar78[0] = ((char)(uVar24 >> 4) + cVar64 & 0xfU) + ((char)(uVar45 >> 4) + cVar93 & 0xfU);
        auVar78[1] = ((bVar84 >> 4) + bVar84 & 0xf) + ((bVar108 >> 4) + bVar108 & 0xf);
        auVar78[2] = ((char)(ushort)((uint)uVar25 >> 0x14) + cVar85 & 0xfU) +
                     ((char)(ushort)((uint)uVar46 >> 0x14) + cVar109 & 0xfU);
        auVar78[3] = ((bVar86 >> 4) + bVar86 & 0xf) + ((bVar110 >> 4) + bVar110 & 0xf);
        auVar78[4] = ((char)(ushort)((uint6)uVar26 >> 0x24) + cVar87 & 0xfU) +
                     ((char)(ushort)((uint6)uVar47 >> 0x24) + cVar111 & 0xfU);
        auVar78[5] = ((bVar88 >> 4) + bVar88 & 0xf) + ((bVar112 >> 4) + bVar112 & 0xf);
        auVar78[6] = ((char)(ushort)((ulong)uVar27 >> 0x34) + cVar89 & 0xfU) +
                     ((char)(ushort)((ulong)uVar48 >> 0x34) + cVar113 & 0xfU);
        auVar78[7] = ((bVar90 >> 4) + bVar90 & 0xf) + ((bVar114 >> 4) + bVar114 & 0xf);
        auVar78[8] = ((char)(ushort)((unkuint10)auVar97._0_10_ >> 0x44) + cVar91 & 0xfU) +
                     ((char)(ushort)((unkuint10)auVar118._0_10_ >> 0x44) + cVar115 & 0xfU);
        auVar78[9] = ((bVar92 >> 4) + bVar92 & 0xf) + ((bVar116 >> 4) + bVar116 & 0xf);
        auVar78[10] = ((char)(auVar97._10_2_ >> 4) + auVar97[10] & 0xfU) +
                      ((char)(auVar118._10_2_ >> 4) + auVar118[10] & 0xfU);
        auVar78[0xb] = ((auVar97[0xb] >> 4) + auVar97[0xb] & 0xf) +
                       ((auVar118[0xb] >> 4) + auVar118[0xb] & 0xf);
        auVar78[0xc] = ((char)(auVar101._12_2_ >> 4) + auVar101[0xc] & 0xfU) +
                       ((char)(auVar120._12_2_ >> 4) + auVar120[0xc] & 0xfU);
        auVar78[0xd] = ((auVar101[0xd] >> 4) + auVar101[0xd] & 0xf) +
                       ((auVar120[0xd] >> 4) + auVar120[0xd] & 0xf);
        auVar78[0xe] = ((char)(auVar107._14_2_ >> 4) + auVar107[0xe] & 0xfU) +
                       ((char)(auVar123._14_2_ >> 4) + auVar123[0xe] & 0xfU);
        auVar78[0xf] = ((auVar107[0xf] >> 4) + auVar107[0xf] & 0xf) +
                       ((auVar123[0xf] >> 4) + auVar123[0xf] & 0xf);
        auVar54 = psadbw(auVar78,(undefined1  [16])0x0);
      }
      lVar28 = lVar28 + auVar57._0_8_;
      lVar40 = lVar40 + auVar57._8_8_;
      lVar41 = lVar41 + auVar54._0_8_;
      lVar44 = lVar44 + auVar54._8_8_;
      uVar20 = uVar20 + auVar57._0_8_;
      uVar21 = uVar21 + auVar57._8_8_;
      uVar22 = uVar22 + auVar54._0_8_;
      uVar23 = uVar23 + auVar54._8_8_;
      uVar9 = uVar9 + 1;
      uVar17 = uVar12 - 1;
    } while (uVar9 < uVar17);
    uVar9 = uVar17 >> 0x19;
    if ((uVar17 & 0x1ffffff) != 0) {
      puVar3 = this->data;
      *(ulong *)(puVar3 + (ulong)(uint)((int)(uVar17 & 0x1ffffff) << 6) + 0x30 + uVar9 * 0x80000000)
           = CONCAT44((int)lVar40,(int)lVar28);
      *(ulong *)(puVar3 + (ulong)(uint)((int)(uVar17 & 0x1ffffff) << 6) + 0x30 + uVar9 * 0x80000000
                + 8) = CONCAT44((int)lVar44,(int)lVar41);
      return;
    }
  }
  ppVar6 = (this->superblock_ranks).super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar4 = ppVar6 + uVar9;
  ppVar4->A = uVar20;
  ppVar4->C = uVar21;
  puVar2 = &ppVar6[uVar9].G;
  *puVar2 = uVar22;
  puVar2[1] = uVar23;
  *(undefined1 (*) [16])(this->data + uVar9 * 0x80000000 + 0x30) = (undefined1  [16])0x0;
  return;
}

Assistant:

void build_rank_support(){

		p_rank superblock_r = {};
		p_rank block_r = {};

		for(uint64_t bl = 0; bl < n_blocks-1; ++bl){

			uint64_t superblock_number = bl/BLOCKS_PER_SUPERBLOCK;
			uint64_t block_number = bl%BLOCKS_PER_SUPERBLOCK;

			if(block_number == 0){

				superblock_ranks[superblock_number]=superblock_r;
				block_r = {};

			}

			set_counters(superblock_number, block_number,block_r);

			p_rank local_rank = block_rank(superblock_number, block_number);

			block_r = block_r + local_rank;
			superblock_r = superblock_r + local_rank;

		}

		uint64_t superblock_number = (n_blocks-1)/BLOCKS_PER_SUPERBLOCK;
		uint64_t block_number = (n_blocks-1)%BLOCKS_PER_SUPERBLOCK;

		if(block_number == 0){

			superblock_ranks[superblock_number]=superblock_r;
			block_r = {};

		}

		set_counters(superblock_number, block_number,block_r);

		assert(check_rank());

	}